

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O2

void av1_cnn_convolve_no_maxpool_padding_valid_avx2
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  undefined8 uVar7;
  int iVar8;
  float *pfVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  int iVar19;
  undefined1 *puVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  __m256i alVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  undefined1 auVar43 [64];
  undefined1 auVar45 [16];
  __m256i weight_mask [2];
  __m256 out_accum [8];
  undefined1 local_280 [4];
  float fStack_27c;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [8];
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [4];
  float fStack_19c;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [4];
  float afStack_fc [7];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  float afStack_60 [12];
  
  auVar34 = _DAT_004c51c0;
  auVar33 = _DAT_004c51a0;
  if (layer_config->filter_width == 2) {
    if (((layer_config->filter_height == 2) && (layer_config->skip_width == 2)) &&
       (layer_config->skip_height == 2)) {
      if (in_height == 0x10 && in_width == 0x10) {
        uStack_278 = 0x100000000;
        _local_280 = 0x100000000;
        uStack_270 = 0x100000000;
        uStack_268 = 0x100000000;
        uStack_258 = 0x300000002;
        local_260 = (undefined1  [8])0x300000002;
        uStack_250 = 0x300000002;
        uStack_248 = 0x300000002;
        lVar27 = (long)in_stride;
        for (lVar16 = (long)start_idx; iVar8 = layer_config->out_channels, lVar16 < iVar8;
            lVar16 = lVar16 + channel_step) {
          fVar6 = layer_config->bias[lVar16];
          for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 0x20) {
            *(float *)(local_1a0 + lVar13) = fVar6;
            *(float *)(local_1a0 + lVar13 + 4) = fVar6;
            *(float *)(local_1a0 + lVar13 + 8) = fVar6;
            *(float *)(local_1a0 + lVar13 + 0xc) = fVar6;
            *(float *)(local_1a0 + lVar13 + 0x10) = fVar6;
            *(float *)(local_1a0 + lVar13 + 0x14) = fVar6;
            *(float *)(local_1a0 + lVar13 + 0x18) = fVar6;
            *(float *)(local_1a0 + lVar13 + 0x1c) = fVar6;
          }
          uVar10 = layer_config->in_channels;
          if (layer_config->in_channels < 1) {
            uVar10 = 0;
          }
          for (uVar29 = 0; uVar29 != uVar10; uVar29 = uVar29 + 1) {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
            prepare_weights_for_2x2_convolve
                      (layer_config->weights,(int)lVar16 + (int)uVar29 * iVar8,cstep,
                       (__m256 *)&local_1e0,(__m256i *)local_280);
            pfVar15 = input[uVar29] + 8;
            for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 0x20) {
              pfVar2 = pfVar15 + lVar27 + -8;
              auVar33._0_4_ = local_1e0 * pfVar15[-8] + local_1c0 * *pfVar2;
              auVar33._4_4_ = fStack_1dc * pfVar15[-7] + fStack_1bc * pfVar2[1];
              auVar33._8_4_ = fStack_1d8 * pfVar15[-6] + fStack_1b8 * pfVar2[2];
              auVar33._12_4_ = fStack_1d4 * pfVar15[-5] + fStack_1b4 * pfVar2[3];
              auVar33._16_4_ = fStack_1d0 * pfVar15[-4] + fStack_1b0 * pfVar2[4];
              auVar33._20_4_ = fStack_1cc * pfVar15[-3] + fStack_1ac * pfVar2[5];
              auVar33._24_4_ = fStack_1c8 * pfVar15[-2] + fStack_1a8 * pfVar2[6];
              fVar6 = in_ZMM4._28_4_;
              auVar33._28_4_ = in_ZMM2._28_4_ + fVar6;
              pfVar2 = pfVar15 + lVar27;
              in_ZMM4 = ZEXT3264(CONCAT428(fVar6,CONCAT424(fStack_1a8 * pfVar2[6],
                                                           CONCAT420(fStack_1ac * pfVar2[5],
                                                                     CONCAT416(fStack_1b0 *
                                                                               pfVar2[4],
                                                                               CONCAT412(fStack_1b4
                                                                                         * pfVar2[3]
                                                                                         ,CONCAT48(
                                                  fStack_1b8 * pfVar2[2],
                                                  CONCAT44(fStack_1bc * pfVar2[1],
                                                           local_1c0 * *pfVar2))))))));
              auVar38._0_4_ = local_1e0 * *pfVar15 + local_1c0 * *pfVar2;
              auVar38._4_4_ = fStack_1dc * pfVar15[1] + fStack_1bc * pfVar2[1];
              auVar38._8_4_ = fStack_1d8 * pfVar15[2] + fStack_1b8 * pfVar2[2];
              auVar38._12_4_ = fStack_1d4 * pfVar15[3] + fStack_1b4 * pfVar2[3];
              auVar38._16_4_ = fStack_1d0 * pfVar15[4] + fStack_1b0 * pfVar2[4];
              auVar38._20_4_ = fStack_1cc * pfVar15[5] + fStack_1ac * pfVar2[5];
              auVar38._24_4_ = fStack_1c8 * pfVar15[6] + fStack_1a8 * pfVar2[6];
              auVar38._28_4_ = in_ZMM3._28_4_ + fVar6;
              in_ZMM3 = ZEXT3264(auVar38);
              auVar33 = vhaddps_avx(auVar33,auVar38);
              auVar33 = vpermpd_avx2(auVar33,0xd8);
              auVar34._0_4_ = auVar33._0_4_ + *(float *)(local_1a0 + lVar13);
              auVar34._4_4_ = auVar33._4_4_ + *(float *)(local_1a0 + lVar13 + 4);
              auVar34._8_4_ = auVar33._8_4_ + *(float *)(local_1a0 + lVar13 + 8);
              auVar34._12_4_ = auVar33._12_4_ + *(float *)(local_1a0 + lVar13 + 0xc);
              auVar34._16_4_ = auVar33._16_4_ + *(float *)(local_1a0 + lVar13 + 0x10);
              auVar34._20_4_ = auVar33._20_4_ + *(float *)(local_1a0 + lVar13 + 0x14);
              auVar34._24_4_ = auVar33._24_4_ + *(float *)(local_1a0 + lVar13 + 0x18);
              auVar34._28_4_ = auVar33._28_4_ + *(float *)(local_1a0 + lVar13 + 0x1c);
              in_ZMM2 = ZEXT3264(auVar34);
              *(undefined1 (*) [32])(local_1a0 + lVar13) = auVar34;
              pfVar15 = pfVar15 + lVar27 * 2;
            }
          }
          lVar13 = 0;
          for (lVar21 = 0; lVar21 != 0x100; lVar21 = lVar21 + 0x20) {
            uVar7 = *(undefined8 *)(local_1a0 + lVar21 + 8);
            uVar11 = *(undefined8 *)(local_1a0 + lVar21 + 0x10);
            uVar12 = *(undefined8 *)(local_1a0 + lVar21 + 0x18);
            puVar1 = (undefined8 *)((long)output[lVar16] + lVar13);
            *puVar1 = *(undefined8 *)(local_1a0 + lVar21);
            puVar1[1] = uVar7;
            puVar1[2] = uVar11;
            puVar1[3] = uVar12;
            lVar13 = lVar13 + (long)out_stride * 4;
          }
        }
        return;
      }
      if (in_height == 8 && in_width == 8) {
        uStack_198 = 0x100000000;
        _local_1a0 = 0x100000000;
        uStack_190 = 0x100000000;
        uStack_188 = 0x100000000;
        local_180._8_8_ = 0x300000002;
        local_180._0_8_ = 0x300000002;
        local_180._16_8_ = 0x300000002;
        local_180._24_8_ = 0x300000002;
        for (lVar16 = (long)start_idx; iVar8 = layer_config->out_channels, lVar16 < iVar8;
            lVar16 = lVar16 + channel_step) {
          fStack_27c = layer_config->bias[lVar16];
          local_280 = (undefined1  [4])fStack_27c;
          uStack_278._0_4_ = fStack_27c;
          uStack_278._4_4_ = fStack_27c;
          uStack_270._0_4_ = fStack_27c;
          uStack_270._4_4_ = fStack_27c;
          uStack_268._0_4_ = fStack_27c;
          uStack_268._4_4_ = fStack_27c;
          local_260._4_4_ = fStack_27c;
          local_260._0_4_ = fStack_27c;
          uStack_258._0_4_ = fStack_27c;
          uStack_258._4_4_ = fStack_27c;
          uStack_250._0_4_ = fStack_27c;
          uStack_250._4_4_ = fStack_27c;
          uStack_248._0_4_ = fStack_27c;
          uStack_248._4_4_ = fStack_27c;
          uVar10 = layer_config->in_channels;
          if (layer_config->in_channels < 1) {
            uVar10 = 0;
          }
          for (uVar29 = 0; uVar29 != uVar10; uVar29 = uVar29 + 1) {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
            prepare_weights_for_2x2_convolve
                      (layer_config->weights,(int)lVar16 + (int)uVar29 * iVar8,cstep,
                       (__m256 *)&local_1e0,(__m256i *)local_1a0);
            pfVar15 = input[uVar29];
            for (lVar27 = 0; lVar27 != 0x40; lVar27 = lVar27 + 0x20) {
              pfVar2 = pfVar15 + in_stride;
              auVar35._0_4_ = local_1e0 * *pfVar15 + local_1c0 * *pfVar2;
              auVar35._4_4_ = fStack_1dc * pfVar15[1] + fStack_1bc * pfVar2[1];
              auVar35._8_4_ = fStack_1d8 * pfVar15[2] + fStack_1b8 * pfVar2[2];
              auVar35._12_4_ = fStack_1d4 * pfVar15[3] + fStack_1b4 * pfVar2[3];
              auVar35._16_4_ = fStack_1d0 * pfVar15[4] + fStack_1b0 * pfVar2[4];
              auVar35._20_4_ = fStack_1cc * pfVar15[5] + fStack_1ac * pfVar2[5];
              auVar35._24_4_ = fStack_1c8 * pfVar15[6] + fStack_1a8 * pfVar2[6];
              auVar35._28_4_ = in_ZMM2._28_4_ + in_ZMM3._28_4_;
              pfVar2 = pfVar15 + in_stride * 2;
              pfVar3 = pfVar15 + in_stride * 3;
              auVar37._0_4_ = local_1c0 * *pfVar3;
              auVar37._4_4_ = fStack_1bc * pfVar3[1];
              auVar37._8_4_ = fStack_1b8 * pfVar3[2];
              auVar37._12_4_ = fStack_1b4 * pfVar3[3];
              auVar37._16_4_ = fStack_1b0 * pfVar3[4];
              auVar37._20_4_ = fStack_1ac * pfVar3[5];
              auVar37._28_36_ = in_ZMM4._28_36_;
              auVar37._24_4_ = fStack_1a8 * pfVar3[6];
              auVar39._0_4_ = local_1e0 * *pfVar2 + auVar37._0_4_;
              auVar39._4_4_ = fStack_1dc * pfVar2[1] + auVar37._4_4_;
              auVar39._8_4_ = fStack_1d8 * pfVar2[2] + auVar37._8_4_;
              auVar39._12_4_ = fStack_1d4 * pfVar2[3] + auVar37._12_4_;
              auVar39._16_4_ = fStack_1d0 * pfVar2[4] + auVar37._16_4_;
              auVar39._20_4_ = fStack_1cc * pfVar2[5] + auVar37._20_4_;
              auVar39._24_4_ = fStack_1c8 * pfVar2[6] + auVar37._24_4_;
              auVar39._28_4_ = in_ZMM3._28_4_ + in_ZMM4._28_4_;
              in_ZMM3 = ZEXT3264(auVar39);
              auVar33 = vhaddps_avx(auVar35,auVar39);
              auVar33 = vpermpd_avx2(auVar33,0xd8);
              auVar36._0_4_ = auVar33._0_4_ + *(float *)(local_280 + lVar27);
              auVar36._4_4_ = auVar33._4_4_ + *(float *)(local_280 + lVar27 + 4);
              auVar36._8_4_ = auVar33._8_4_ + *(float *)(local_280 + lVar27 + 8);
              auVar36._12_4_ = auVar33._12_4_ + *(float *)(local_280 + lVar27 + 0xc);
              auVar36._16_4_ = auVar33._16_4_ + *(float *)(local_280 + lVar27 + 0x10);
              auVar36._20_4_ = auVar33._20_4_ + *(float *)(local_280 + lVar27 + 0x14);
              auVar36._24_4_ = auVar33._24_4_ + *(float *)(local_280 + lVar27 + 0x18);
              auVar36._28_4_ = auVar33._28_4_ + *(float *)(local_280 + lVar27 + 0x1c);
              in_ZMM2 = ZEXT3264(auVar36);
              *(undefined1 (*) [32])(local_280 + lVar27) = auVar36;
              pfVar15 = pfVar15 + (long)in_stride * 4;
              in_ZMM4 = ZEXT3264(auVar37._0_32_);
            }
          }
          pfVar15 = output[lVar16];
          *(longlong *)pfVar15 = _local_280;
          *(longlong *)(pfVar15 + 2) = uStack_278;
          *(longlong *)(pfVar15 + 4) = uStack_270;
          *(longlong *)(pfVar15 + 6) = uStack_268;
          pfVar15 = output[lVar16] + out_stride * 2;
          *(undefined1 (*) [8])pfVar15 = local_260;
          *(longlong *)(pfVar15 + 2) = uStack_258;
          *(longlong *)(pfVar15 + 4) = uStack_250;
          *(longlong *)(pfVar15 + 6) = uStack_248;
        }
        return;
      }
    }
  }
  else if (((layer_config->filter_width == 5) && (layer_config->filter_height == 5)) &&
          ((layer_config->skip_width == 4 && (layer_config->skip_height == 4)))) {
    iVar8 = layer_config->out_channels;
    lVar16 = (long)in_stride;
    for (lVar27 = (long)start_idx; lVar27 < iVar8; lVar27 = lVar27 + channel_step) {
      fVar6 = layer_config->bias[lVar27];
      uVar10 = layer_config->in_channels;
      if (layer_config->in_channels < 1) {
        uVar10 = 0;
      }
      for (uVar29 = 0; uVar29 != uVar10; uVar29 = uVar29 + 1) {
        _local_200 = ZEXT1632(ZEXT816(0) << 0x40);
        local_220 = _local_200;
        alVar31 = (__m256i)ZEXT1632(ZEXT816(0) << 0x40);
        local_240._0_8_ = alVar31[0];
        local_240._8_8_ = alVar31[1];
        local_240._16_8_ = alVar31[2];
        local_240._24_8_ = alVar31[3];
        local_260 = (undefined1  [8])alVar31[0];
        uStack_258 = alVar31[1];
        uStack_250 = alVar31[2];
        uStack_248 = alVar31[3];
        _local_280 = alVar31[0];
        uStack_278 = alVar31[1];
        uStack_270 = alVar31[2];
        uStack_268 = alVar31[3];
        lVar13 = uVar29 * (long)iVar8 + lVar27;
        pfVar15 = layer_config->weights;
        puVar20 = local_280;
        for (lVar21 = 0; lVar21 != 5; lVar21 = lVar21 + 1) {
          lVar13 = (long)(int)lVar13;
          for (lVar24 = 0; lVar24 != 5; lVar24 = lVar24 + 1) {
            *(float *)(puVar20 + lVar24 * 4) = pfVar15[lVar13];
            lVar13 = lVar13 + cstep;
          }
          puVar20 = puVar20 + 0x20;
        }
        alVar31 = (__m256i)vpermps_avx2(_DAT_004c5160,(undefined1  [32])_local_280);
        _local_1a0 = alVar31[0];
        uStack_198 = alVar31[1];
        uStack_190 = alVar31[2];
        uStack_188 = alVar31[3];
        local_180 = vpermps_avx2(_DAT_004c5160,(undefined1  [32])_local_260);
        local_160 = vpermps_avx2(_DAT_004c5160,local_240);
        local_140 = vpermps_avx2(_DAT_004c5160,local_220);
        local_120 = vpermps_avx2(_DAT_004c5160,_local_200);
        _local_100 = vpermps_avx2(_DAT_004c5180,(undefined1  [32])_local_280);
        local_e0 = vpermps_avx2(_DAT_004c5180,(undefined1  [32])_local_260);
        local_c0 = vpermps_avx2(_DAT_004c5180,local_240);
        local_a0 = vpermps_avx2(_DAT_004c5180,local_220);
        local_80 = vpermps_avx2(_DAT_004c5180,_local_200);
        lVar13 = 4;
        lVar26 = 0;
        lVar24 = 0;
        lVar23 = 0;
        for (lVar21 = 0; lVar21 < in_height + -4; lVar21 = lVar21 + 4) {
          lVar17 = lVar23 * out_stride;
          lVar22 = 0;
          lVar14 = lVar13;
          lVar25 = lVar26;
          lVar28 = lVar24;
          for (iVar19 = in_width; 0xc < iVar19; iVar19 = iVar19 + -0xc) {
            pauVar18 = (undefined1 (*) [32])((long)input[uVar29] + lVar28);
            auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
            lVar30 = -0xa0;
            auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
            while( true ) {
              fVar44 = auVar43._16_4_;
              if (lVar30 == 0) break;
              auVar38 = vpermilps_avx(*pauVar18,auVar33);
              auVar35 = vpermps_avx2(auVar34,*(undefined1 (*) [32])(*pauVar18 + 0x1c));
              auVar43 = ZEXT3264(CONCAT428(auVar43._28_4_ + auVar38._28_4_,
                                           CONCAT424(auVar43._24_4_ +
                                                     auVar38._24_4_ *
                                                     *(float *)(local_100 + lVar30 + 0x18),
                                                     CONCAT420(auVar43._20_4_ +
                                                               auVar38._20_4_ *
                                                               *(float *)(local_100 + lVar30 + 0x14)
                                                               ,CONCAT416(fVar44 + auVar38._16_4_ *
                                                                                   *(float *)(
                                                  local_100 + lVar30 + 0x10),
                                                  CONCAT412(auVar43._12_4_ +
                                                            auVar38._12_4_ *
                                                            *(float *)(local_100 + lVar30 + 0xc),
                                                            CONCAT48(auVar43._8_4_ +
                                                                     auVar38._8_4_ *
                                                                     *(float *)(local_100 +
                                                                               lVar30 + 8),
                                                                     CONCAT44(auVar43._4_4_ +
                                                                              auVar38._4_4_ *
                                                                              *(float *)(local_100 +
                                                                                        lVar30 + 4),
                                                                              auVar43._0_4_ +
                                                                              auVar38._0_4_ *
                                                                              *(float *)(local_100 +
                                                                                        lVar30))))))
                                                  )));
              auVar37 = ZEXT3264(CONCAT428(auVar35._28_4_ + auVar37._28_4_,
                                           CONCAT424(auVar35._24_4_ *
                                                     *(float *)((long)afStack_60 + lVar30 + 0x18) +
                                                     auVar37._24_4_,
                                                     CONCAT420(auVar35._20_4_ *
                                                               *(float *)((long)afStack_60 +
                                                                         lVar30 + 0x14) +
                                                               auVar37._20_4_,
                                                               CONCAT416(auVar35._16_4_ *
                                                                         *(float *)((long)afStack_60
                                                                                   + lVar30 + 0x10)
                                                                         + auVar37._16_4_,
                                                                         CONCAT412(auVar35._12_4_ *
                                                                                   *(float *)((long)
                                                  afStack_60 + lVar30 + 0xc) + auVar37._12_4_,
                                                  CONCAT48(auVar35._8_4_ *
                                                           *(float *)((long)afStack_60 + lVar30 + 8)
                                                           + auVar37._8_4_,
                                                           CONCAT44(auVar35._4_4_ *
                                                                    *(float *)((long)afStack_60 +
                                                                              lVar30 + 4) +
                                                                    auVar37._4_4_,
                                                                    auVar35._0_4_ *
                                                                    *(float *)((long)afStack_60 +
                                                                              lVar30) +
                                                                    auVar37._0_4_))))))));
              lVar30 = lVar30 + 0x20;
              pauVar18 = (undefined1 (*) [32])(*pauVar18 + lVar16 * 4);
            }
            auVar38 = vhaddps_avx(auVar43._0_32_,auVar37._0_32_);
            pfVar15 = output[lVar27];
            auVar42 = auVar38._0_16_;
            auVar40._0_4_ = auVar38._16_4_ + fVar44;
            auVar40._4_4_ = auVar38._20_4_ + auVar43._20_4_;
            auVar40._8_4_ = auVar38._24_4_ + auVar43._24_4_;
            auVar40._12_4_ = auVar38._28_4_ + auVar43._28_4_;
            auVar45._0_4_ = fVar44 + auVar38._0_4_;
            auVar45._4_4_ = fVar44 + auVar38._4_4_;
            auVar45._8_4_ = fVar44 + auVar38._8_4_;
            auVar45._12_4_ = fVar44 + auVar38._12_4_;
            auVar32 = vblendps_avx(auVar45,auVar40,2);
            auVar40 = vshufps_avx(auVar42,auVar42,0xe9);
            auVar41._0_4_ = auVar40._0_4_ + fVar6 + auVar32._0_4_;
            auVar41._4_4_ = auVar40._4_4_ + fVar6 + auVar32._4_4_;
            auVar41._8_4_ = auVar40._8_4_ + fVar6 + auVar32._8_4_;
            auVar41._12_4_ = auVar40._12_4_ + fVar6 + auVar32._12_4_;
            uVar7 = vmovlps_avx(auVar41);
            *(undefined8 *)(pfVar15 + lVar22 + lVar17) = uVar7;
            auVar32._0_4_ = auVar38._16_4_ + auVar37._16_4_;
            auVar32._4_4_ = auVar38._20_4_ + auVar37._20_4_;
            auVar32._8_4_ = auVar38._24_4_ + auVar37._24_4_;
            auVar32._12_4_ = auVar38._28_4_ + auVar37._28_4_;
            auVar32 = vshufpd_avx(auVar32,auVar32,1);
            auVar40 = vshufps_avx(auVar42,auVar42,0xff);
            pfVar15[lVar22 + lVar17 + 2] = auVar40._0_4_ + fVar6 + auVar32._0_4_;
            lVar22 = lVar22 + 3;
            lVar28 = lVar28 + 0x30;
            lVar25 = lVar25 + 0xc;
            lVar14 = lVar14 + 0xc;
          }
          for (; 4 < iVar19; iVar19 = iVar19 + -4) {
            pfVar9 = input[uVar29];
            pfVar15 = pfVar9 + lVar14 + lVar16 + -4;
            pfVar2 = pfVar9 + lVar14 + lVar16 * 2 + -4;
            pfVar3 = pfVar9 + lVar14 + lVar16 * 3 + -4;
            pfVar4 = pfVar9 + lVar14 + lVar16 * 4 + -4;
            pfVar5 = pfVar9 + lVar14 + -4;
            auVar42._0_4_ =
                 local_280 * *pfVar5 + 0.0 +
                 local_240._0_4_ * *pfVar2 + local_260._0_4_ * *pfVar15 +
                 (float)local_200._0_4_ * *pfVar4 + local_220._0_4_ * *pfVar3;
            auVar42._4_4_ =
                 local_280._4_4_ * pfVar5[1] + 0.0 +
                 local_240._4_4_ * pfVar2[1] + local_260._4_4_ * pfVar15[1] +
                 (float)local_200._4_4_ * pfVar4[1] + local_220._4_4_ * pfVar3[1];
            auVar42._8_4_ =
                 local_280._8_4_ * pfVar5[2] + 0.0 +
                 local_240._8_4_ * pfVar2[2] + local_260._8_4_ * pfVar15[2] +
                 fStack_1f8 * pfVar4[2] + local_220._8_4_ * pfVar3[2];
            auVar42._12_4_ =
                 local_280._12_4_ * pfVar5[3] + 0.0 +
                 local_240._12_4_ * pfVar2[3] + local_260._12_4_ * pfVar15[3] +
                 fStack_1f4 * pfVar4[3] + local_220._12_4_ * pfVar3[3];
            auVar32 = vhaddps_avx(auVar42,auVar42);
            auVar40 = vmovshdup_avx(auVar32);
            *(float *)((long)output[lVar27] + lVar25) =
                 auVar40._0_4_ +
                 fVar6 + fStack_1f0 * pfVar9[lVar14 + lVar16 * 4] +
                         (float)local_220._16_4_ * pfVar9[lVar14 + lVar16 * 3] +
                         (float)local_240._16_4_ * pfVar9[lVar14 + lVar16 * 2] +
                         (float)uStack_250 * pfVar9[lVar14 + lVar16] +
                         (float)uStack_270 * pfVar9[lVar14] + 0.0 + auVar32._0_4_;
            lVar25 = lVar25 + 4;
            lVar14 = lVar14 + 4;
          }
          lVar23 = lVar23 + 1;
          lVar24 = lVar24 + lVar16 * 0x10;
          lVar26 = lVar26 + (long)out_stride * 4;
          lVar13 = lVar13 + lVar16 * 4;
        }
      }
    }
    return;
  }
  av1_cnn_convolve_no_maxpool_padding_valid_c
            (input,in_width,in_height,in_stride,layer_config,output,out_stride,start_idx,cstep,
             channel_step);
  return;
}

Assistant:

void av1_cnn_convolve_no_maxpool_padding_valid_avx2(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *layer_config, float **output, int out_stride,
    int start_idx, int cstep, int channel_step) {
  if (layer_config->filter_width == 5 && layer_config->filter_height == 5 &&
      layer_config->skip_width == 4 && layer_config->skip_height == 4) {
    cnn_convolve_no_maxpool_padding_valid_5x5_avx2(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  } else if (layer_config->filter_width == 2 &&
             layer_config->filter_height == 2 &&
             layer_config->skip_width == 2 && layer_config->skip_height == 2) {
    cnn_convolve_no_maxpool_padding_valid_2x2_avx2(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  } else {
    av1_cnn_convolve_no_maxpool_padding_valid_c(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  }
}